

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf_writer.c
# Opt level: O2

void duckdb_je_buf_writer_flush(buf_writer_t *buf_writer)

{
  if (buf_writer->buf != (char *)0x0) {
    buf_writer->buf[buf_writer->buf_end] = '\0';
    (*buf_writer->write_cb)(buf_writer->cbopaque,buf_writer->buf);
    buf_writer->buf_end = 0;
  }
  return;
}

Assistant:

void
buf_writer_flush(buf_writer_t *buf_writer) {
	buf_writer_assert(buf_writer);
	if (buf_writer->buf == NULL) {
		return;
	}
	buf_writer->buf[buf_writer->buf_end] = '\0';
	buf_writer->write_cb(buf_writer->cbopaque, buf_writer->buf);
	buf_writer->buf_end = 0;
	buf_writer_assert(buf_writer);
}